

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void SVGChart::MakeExamplePlot3(PPlot *ioPPlot)

{
  PPlot *pPVar1;
  undefined8 *puVar2;
  PlotDataBase *inYData;
  int theI;
  int iVar3;
  float fVar4;
  float local_40;
  float local_3c;
  PPlot *local_38;
  
  local_38 = ioPPlot;
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = &PTR__PlotData_00111c00;
  inYData = (PlotDataBase *)operator_new(0x20);
  inYData->_vptr_PlotDataBase = (_func_int **)0x0;
  inYData[1]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData[2]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData[3]._vptr_PlotDataBase = (_func_int **)0x0;
  inYData->_vptr_PlotDataBase = (_func_int **)&PTR__PlotData_00111c00;
  for (iVar3 = 0; pPVar1 = local_38, iVar3 != 0x65; iVar3 = iVar3 + 1) {
    fVar4 = (float)iVar3;
    local_3c = fVar4;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)(puVar2 + 1),&local_3c);
    local_40 = fVar4 * 1e-06 * fVar4 * fVar4;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              ((vector<float,_std::allocator<float>_> *)(inYData + 1),&local_40);
  }
  PlotDataContainer::AddXYPlot
            (&local_38->mPlotDataContainer,(PlotDataBase *)0x0,inYData,(LegendData *)0x0,
             (DataDrawerBase *)0x0,(PlotDataSelection *)0x0);
  std::__cxx11::string::assign((char *)&(pPVar1->mPlotBackground).mTitle);
  (pPVar1->mPlotBackground).mTransparent = false;
  (pPVar1->mPlotBackground).mPlotRegionBackColor.mR = 200;
  (pPVar1->mPlotBackground).mPlotRegionBackColor.mG = 200;
  (pPVar1->mPlotBackground).mPlotRegionBackColor.mB = 200;
  (pPVar1->mMargins).mTop = 0x14;
  (pPVar1->mMargins).mRight = 10;
  (pPVar1->mMargins).mLeft = 10;
  (pPVar1->mMargins).mBottom = 10;
  return;
}

Assistant:

void MakeExamplePlot3 (PPlot &ioPPlot) {

      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 1.0f/(100*100*100);
      for (int theI=0;theI<=100;theI++) {
        //    theX1->push_back (theI*0.001);
        theX1->push_back (theI);
        theY1->push_back (theFac*theI*theI*theI);
      }
      ioPPlot.mPlotDataContainer.AddXYPlot (nullptr, theY1, nullptr);

      ioPPlot.mPlotBackground.mTitle = "narrow margins";
      ioPPlot.mPlotBackground.mTransparent = false;
      ioPPlot.mPlotBackground.mPlotRegionBackColor = PColor (200,200,200);
      ioPPlot.mMargins.mTop = 20;
      ioPPlot.mMargins.mRight = 10;
      ioPPlot.mMargins.mLeft = 10;
      ioPPlot.mMargins.mBottom = 10;
    }